

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlanningUnitMADPDiscrete.cpp
# Opt level: O0

Index __thiscall
PlanningUnitMADPDiscrete::GetJointObservationHistoryIndex
          (PlanningUnitMADPDiscrete *this,JointObservationHistoryTree *joh)

{
  undefined8 uVar1;
  char *in_stack_00000008;
  E *in_stack_00000010;
  
  uVar1 = __cxa_allocate_exception(0x28);
  E::E(in_stack_00000010,in_stack_00000008);
  __cxa_throw(uVar1,&E::typeinfo,E::~E);
}

Assistant:

Index PlanningUnitMADPDiscrete::GetJointObservationHistoryIndex(
        JointObservationHistoryTree* joh) const
{
    throw E("GetJointObservationHistoryIndex(JointObservationHistoryTree* joh) seems like a dumb-ass function? I mean looping over exponentially many histories does not seem like a nice thing to do?");

    for(Index i=0;i<_m_nrJointObservationHistories;i++)
    {
        if(_m_jointObservationHistoryTreeVector.at(i)==joh)
            return(i);
    }
    // we should not get here
    throw E("GetJointObservationHistoryIndex index not found");
    return(0);
}